

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbg.c
# Opt level: O0

void dbgent(dbgcxdef *ctx,runsdef *bp,objnum self,objnum target,prpnum prop,int binum,int argc)

{
  undefined8 *puVar1;
  undefined2 in_CX;
  undefined2 in_DX;
  undefined8 in_RSI;
  long in_RDI;
  undefined2 in_R8W;
  undefined4 in_R9D;
  int l;
  char *p_1;
  char buf [128];
  dbgfdef *p;
  int local_b4;
  undefined1 *puVar2;
  char *in_stack_ffffffffffffff58;
  dbgcxdef *in_stack_ffffffffffffff60;
  
  *(int *)(in_RDI + 0x2c) = *(int *)(in_RDI + 0x2c) + 1;
  if (*(int *)(in_RDI + 0x28) == 100) {
    *(int *)(in_RDI + 0x28) = *(int *)(in_RDI + 0x28) + -1;
    memmove((void *)(in_RDI + 0x38),(void *)(in_RDI + 0x58),0xc60);
  }
  puVar1 = (undefined8 *)(in_RDI + 0x38 + (long)*(int *)(in_RDI + 0x28) * 0x20);
  *(int *)(in_RDI + 0x28) = *(int *)(in_RDI + 0x28) + 1;
  *puVar1 = in_RSI;
  *(undefined2 *)(puVar1 + 1) = in_DX;
  *(undefined2 *)((long)puVar1 + 10) = in_CX;
  *(undefined2 *)((long)puVar1 + 0xc) = in_R8W;
  *(undefined4 *)((long)puVar1 + 0x14) = in_R9D;
  *(undefined4 *)(puVar1 + 2) = p_1._0_4_;
  *(undefined4 *)(puVar1 + 3) = 0;
  *(undefined4 *)((long)puVar1 + 0x1c) = 0;
  if ((*(uint *)(in_RDI + 0xcb8) & 0x20) != 0) {
    puVar2 = &stack0xffffffffffffff58;
    dbgstktr((dbgcxdef *)buf._32_8_,(_func_void_void_ptr_char_ptr_int *)buf._24_8_,
             (void *)buf._16_8_,buf._12_4_,buf._8_4_,buf._4_4_);
    local_b4 = (int)puVar2 - (int)&stack0xffffffffffffff58;
    if ((0 < local_b4) && ((&stack0xffffffffffffff58)[local_b4 + -1] == '\n')) {
      local_b4 = local_b4 + -1;
    }
    (&stack0xffffffffffffff58)[local_b4] = 0;
    dbgaddhist(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,(int)((ulong)puVar2 >> 0x20));
  }
  return;
}

Assistant:

void dbgent(dbgcxdef *ctx, runsdef *bp, objnum self, objnum target,
            prpnum prop, int binum, int argc)
{
    dbgfdef *p;
    
    ++(ctx->dbgcxdep);                            /* increment actual depth */
    if (ctx->dbgcxfcn == DBGMAXFRAME)
    {
        --(ctx->dbgcxfcn);                             /* back to top frame */
        memmove(ctx->dbgcxfrm, ctx->dbgcxfrm + 1,
                (size_t)((DBGMAXFRAME - 1) * sizeof(dbgfdef)));
    }
    p = &ctx->dbgcxfrm[ctx->dbgcxfcn];
    ++(ctx->dbgcxfcn);                           /* increment frame pointer */

    p->dbgfbp = bp;
    p->dbgfself = self;
    p->dbgftarg = target;
    p->dbgfprop = prop;
    p->dbgfbif  = binum;
    p->dbgfargc = argc;
    p->dbgffr = 0;                        /* no frame has yet been recorded */
    p->dbgflin = 0;

    /* save call history */
    if (ctx->dbgcxflg & DBGCXFTRC)
    {
        char  buf[128];
        char *p;
        int   l;

        p = buf;
        dbgstktr(ctx, dbgent1, &p, -1, TRUE, FALSE);
        if ((l = (p - buf)) > 0 && buf[l-1] == '\n') --l;
        buf[l++] = '\0';
        dbgaddhist(ctx, buf, l);
    }
}